

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
* __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::find(arg_map<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
       *this,basic_string_view<char> name)

{
  uint uVar1;
  long lVar2;
  basic_string_view<char> rhs;
  bool bVar3;
  size_t in_RCX;
  char *in_RDX;
  long *in_RSI;
  basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_RDI;
  entry *end;
  entry *it;
  basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *this_00;
  basic_string_view<char> *local_20;
  
  local_20 = (basic_string_view<char> *)*in_RSI;
  lVar2 = *in_RSI;
  uVar1 = *(uint *)(in_RSI + 1);
  this_00 = in_RDI;
  while( true ) {
    if (local_20 == (basic_string_view<char> *)(lVar2 + (ulong)uVar1 * 0x30)) {
      basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
      ::basic_format_arg(this_00);
      return this_00;
    }
    rhs.size_ = in_RCX;
    rhs.data_ = in_RDX;
    bVar3 = v5::operator==(*local_20,rhs);
    if (bVar3) break;
    local_20 = local_20 + 3;
  }
  (in_RDI->value_).field_0.long_long_value = (longlong)local_20[1].data_;
  (in_RDI->value_).field_0.string.size = local_20[1].size_;
  *(char **)&in_RDI->type_ = local_20[2].data_;
  *(size_t *)&in_RDI->field_0x18 = local_20[2].size_;
  return this_00;
}

Assistant:

basic_format_arg<Context> find(basic_string_view<char_type> name) const {
    // The list is unsorted, so just return the first matching name.
    for (entry *it = map_, *end = map_ + size_; it != end; ++it) {
      if (it->name == name)
        return it->arg;
    }
    return {};
  }